

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O1

size_t ares_count_hexdigits(size_t n)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = 0;
  if (n != 0) {
    do {
      lVar2 = lVar2 + 1;
      bVar1 = 0xf < n;
      n = n >> 4;
    } while (bVar1);
  }
  return lVar2 + (ulong)(lVar2 == 0);
}

Assistant:

size_t ares_count_hexdigits(size_t n)
{
  size_t digits;

  for (digits = 0; n > 0; digits++) {
    n /= 16;
  }
  if (digits == 0) {
    digits = 1;
  }

  return digits;
}